

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_pack8.h
# Opt level: O0

void ncnn::conv3x3s1_winograd23_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel_tm,Mat *bias,Option *opt)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  Mat *in_RSI;
  undefined8 *in_RDI;
  Mat top_blob_bordered;
  Mat top_blob_tm;
  int tiles;
  int h_tiles;
  int w_tiles;
  Mat bottom_blob_tm;
  Mat bottom_blob_bordered;
  int outch;
  int outh;
  int outw;
  int elempack;
  size_t elemsize;
  int inch;
  int h;
  int w;
  Option *in_stack_000018f0;
  Mat *in_stack_000018f8;
  Mat *in_stack_00001900;
  int in_stack_0000190c;
  Mat *in_stack_00001910;
  int in_stack_fffffffffffffba4;
  size_t in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  int _c;
  Mat **ppMVar4;
  undefined8 in_stack_fffffffffffffbb8;
  Allocator *pAVar5;
  Mat *in_stack_fffffffffffffbc0;
  void **ppvVar6;
  undefined8 in_stack_fffffffffffffbc8;
  Mat *pMVar7;
  int in_stack_fffffffffffffbd0;
  int in_stack_fffffffffffffbd4;
  Mat *in_stack_fffffffffffffbd8;
  Mat *in_stack_fffffffffffffbe0;
  int in_stack_fffffffffffffbf0;
  Option *in_stack_fffffffffffffbf8;
  Mat local_3c8;
  void *local_380;
  int *local_378;
  undefined8 local_370;
  undefined4 local_368;
  long *local_360;
  undefined4 local_358;
  undefined4 local_354;
  undefined4 local_350;
  undefined4 local_34c;
  undefined4 local_348;
  undefined8 local_340;
  Mat *local_338;
  int *local_330;
  undefined8 local_328;
  undefined4 local_320;
  long *local_318;
  undefined4 local_310;
  undefined4 local_30c;
  undefined4 local_308;
  undefined4 local_304;
  undefined4 local_300;
  undefined8 local_2f8;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  Allocator local_2e0;
  int *local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c8;
  long *local_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  undefined4 local_2a8;
  undefined8 local_2a0;
  Mat *local_288;
  Mat *local_280;
  Mat *local_278;
  undefined4 local_270;
  Mat *local_268;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  Mat *local_248;
  int local_240;
  uint local_23c;
  uint local_238;
  undefined4 local_234;
  undefined8 local_230;
  undefined4 local_224;
  int local_220;
  int local_21c;
  Mat *local_200;
  Allocator *local_1f0;
  Mat **local_1e8;
  void **local_1e0;
  Mat *local_1d8;
  Mat **local_1d0;
  Mat *local_1c0;
  void **local_1b0;
  Allocator *local_1a0;
  Mat **local_190;
  int local_180;
  undefined4 local_17c;
  Mat *local_170;
  Mat *local_168;
  Mat **local_158;
  Mat **local_150;
  Mat **local_148;
  int local_140;
  undefined4 local_13c;
  Mat **local_138;
  Mat *local_128;
  int local_110;
  undefined4 local_10c;
  Mat **local_108;
  int local_f0;
  undefined4 local_ec;
  Allocator *local_e8;
  int local_d0;
  undefined4 local_cc;
  void **local_c8;
  int local_b0;
  undefined4 local_ac;
  Mat *local_a8;
  int local_90;
  undefined4 local_8c;
  Mat **local_88;
  Mat **local_78;
  Mat *local_70;
  void *local_60;
  void *local_50;
  _func_int **local_40;
  Option *in_stack_ffffffffffffffd0;
  Mat *in_stack_ffffffffffffffd8;
  Mat *in_stack_ffffffffffffffe0;
  Mat *in_stack_ffffffffffffffe8;
  
  _c = (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
  local_224 = *(undefined4 *)(in_RDI + 7);
  local_230 = in_RDI[2];
  local_234 = *(undefined4 *)(in_RDI + 3);
  iVar1 = in_RSI->w;
  iVar2 = in_RSI->h;
  local_240 = in_RSI->c;
  local_78 = &local_288;
  local_288 = (Mat *)*in_RDI;
  local_280 = (Mat *)in_RDI[1];
  local_278 = (Mat *)in_RDI[2];
  local_270 = *(undefined4 *)(in_RDI + 3);
  local_268 = (Mat *)in_RDI[4];
  local_260 = *(undefined4 *)(in_RDI + 5);
  local_25c = *(undefined4 *)((long)in_RDI + 0x2c);
  local_258 = *(undefined4 *)(in_RDI + 6);
  local_254 = *(undefined4 *)((long)in_RDI + 0x34);
  local_250 = *(undefined4 *)(in_RDI + 7);
  local_248 = (Mat *)in_RDI[8];
  if (local_280 != (Mat *)0x0) {
    LOCK();
    *(int *)&local_280->data = *(int *)&local_280->data + 1;
    UNLOCK();
  }
  local_238 = (iVar1 + 1) - (iVar1 + 1 >> 0x1f) & 0xfffffffe;
  local_23c = (iVar2 + 1) - (iVar2 + 1 >> 0x1f) & 0xfffffffe;
  local_21c = local_238 + 2;
  local_220 = local_23c + 2;
  local_200 = in_RSI;
  copy_make_border(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                   in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                   (int)in_stack_fffffffffffffbc8,in_stack_fffffffffffffbf0,
                   (float)((ulong)in_stack_fffffffffffffbc0 >> 0x20),in_stack_fffffffffffffbf8);
  pAVar5 = &local_2e0;
  local_2e0._vptr_Allocator = (_func_int **)0x0;
  local_2d8 = (int *)0x0;
  local_2d0 = 0;
  local_2c8 = 0;
  local_2c0 = (long *)0x0;
  local_2b8 = 0;
  local_2b4 = 0;
  local_2b0 = 0;
  local_2ac = 0;
  local_2a8 = 0;
  local_2a0 = 0;
  local_2e4 = (int)local_238 / 2;
  local_2e8 = (int)local_23c / 2;
  local_2ec = local_2e4 * local_2e8;
  local_1f0 = pAVar5;
  Mat::create(in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
              (int)in_stack_fffffffffffffbb8,_c,in_stack_fffffffffffffba8,in_stack_fffffffffffffba4,
              pAVar5);
  conv3x3s1_winograd23_transform_input_pack8_avx
            ((Mat *)top_blob_tm._24_8_,(Mat *)top_blob_tm.elemsize,(Option *)top_blob_tm.refcount);
  local_1e8 = &local_338;
  local_338 = (Mat *)0x0;
  local_330 = (int *)0x0;
  local_328 = 0;
  local_320 = 0;
  local_318 = (long *)0x0;
  local_310 = 0;
  local_30c = 0;
  local_308 = 0;
  local_304 = 0;
  local_300 = 0;
  local_2f8 = 0;
  local_158 = &local_338;
  local_150 = &local_288;
  if (&local_288 != local_158) {
    local_138 = &local_288;
    if (local_280 != (Mat *)0x0) {
      local_13c = 0xffffffff;
      LOCK();
      local_140 = *(int *)&local_280->data;
      *(int *)&local_280->data = *(int *)&local_280->data + -1;
      UNLOCK();
      if (local_140 == 1) {
        if (local_268 == (Mat *)0x0) {
          in_stack_ffffffffffffffe8 = local_288;
          if (local_288 != (Mat *)0x0) {
            free(local_288);
            in_stack_ffffffffffffffe8 = local_288;
          }
        }
        else {
          (**(code **)((long)local_268->data + 0x18))(local_268,local_288);
        }
      }
    }
    local_288 = (Mat *)0x0;
    local_278 = (Mat *)0x0;
    local_270 = 0;
    local_260 = 0;
    local_25c = 0;
    local_258 = 0;
    local_254 = 0;
    local_250 = 0;
    local_248 = (Mat *)0x0;
    local_280 = (Mat *)0x0;
    local_288 = *local_158;
    local_280 = local_158[1];
    local_278 = local_158[2];
    local_270 = *(undefined4 *)(local_158 + 3);
    local_268 = local_158[4];
    local_260 = *(undefined4 *)(local_158 + 5);
    local_25c = *(undefined4 *)((long)local_158 + 0x2c);
    local_258 = *(undefined4 *)(local_158 + 6);
    local_254 = *(undefined4 *)((long)local_158 + 0x34);
    local_250 = *(undefined4 *)(local_158 + 7);
    local_248 = local_158[8];
  }
  local_1d0 = &local_338;
  local_148 = &local_288;
  local_88 = local_1d0;
  if (local_330 != (int *)0x0) {
    local_8c = 0xffffffff;
    LOCK();
    local_90 = *local_330;
    *local_330 = *local_330 + -1;
    UNLOCK();
    if (local_90 == 1) {
      if (local_318 == (long *)0x0) {
        local_70 = local_338;
        if (local_338 != (Mat *)0x0) {
          free(local_338);
        }
      }
      else {
        (**(code **)(*local_318 + 0x18))(local_318,local_338);
      }
    }
  }
  local_338 = (Mat *)0x0;
  local_328 = 0;
  local_320 = 0;
  local_310 = 0;
  local_30c = 0;
  local_308 = 0;
  local_304 = 0;
  local_300 = 0;
  local_2f8 = 0;
  local_330 = (int *)0x0;
  local_1e0 = &local_380;
  local_380 = (void *)0x0;
  local_378 = (int *)0x0;
  local_370 = 0;
  local_368 = 0;
  local_360 = (long *)0x0;
  local_358 = 0;
  local_354 = 0;
  local_350 = 0;
  local_34c = 0;
  local_348 = 0;
  local_340 = 0;
  convolution_winograd_dot_pack8_avx
            (in_stack_00001910,in_stack_0000190c,in_stack_00001900,in_stack_000018f8,
             in_stack_000018f0);
  pMVar7 = &local_3c8;
  local_3c8.data = (void *)0x0;
  local_3c8.refcount = (int *)0x0;
  local_3c8.elemsize = 0;
  local_3c8.elempack = 0;
  local_3c8.allocator = (Allocator *)0x0;
  local_3c8.dims = 0;
  local_3c8.w = 0;
  local_3c8.h = 0;
  local_3c8.d = 0;
  local_3c8.c = 0;
  local_3c8.cstep = 0;
  local_1d8 = pMVar7;
  if ((local_238 == local_200->w) && (local_23c == local_200->h)) {
    local_170 = &local_3c8;
    local_168 = local_170;
    if (local_170 != local_200) {
      if (local_200->refcount != (int *)0x0) {
        piVar3 = local_200->refcount;
        local_17c = 1;
        LOCK();
        local_180 = *piVar3;
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      local_3c8.data = local_200->data;
      local_3c8.refcount = local_200->refcount;
      local_3c8.elemsize = local_200->elemsize;
      local_3c8.elempack = local_200->elempack;
      local_3c8.allocator = local_200->allocator;
      local_3c8.dims = local_200->dims;
      local_3c8.w = local_200->w;
      local_3c8.h = local_200->h;
      local_3c8.d = local_200->d;
      local_3c8.c = local_200->c;
      local_3c8.cstep = local_200->cstep;
      in_stack_fffffffffffffbe0 = local_170;
      local_128 = local_170;
    }
  }
  else {
    Mat::create(in_stack_fffffffffffffbc0,(int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                (int)in_stack_fffffffffffffbb8,_c,in_stack_fffffffffffffba8,
                in_stack_fffffffffffffba4,pAVar5);
  }
  conv3x3s1_winograd23_transform_output_pack8_avx
            (in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  copy_cut_border(in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd4,
                  in_stack_fffffffffffffbd0,(int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                  (int)in_stack_fffffffffffffbc8,(Option *)pMVar7);
  pMVar7 = &local_3c8;
  local_1c0 = pMVar7;
  local_a8 = pMVar7;
  if (local_3c8.refcount != (int *)0x0) {
    local_ac = 0xffffffff;
    LOCK();
    local_b0 = *local_3c8.refcount;
    *local_3c8.refcount = *local_3c8.refcount + -1;
    UNLOCK();
    if (local_b0 == 1) {
      if (local_3c8.allocator == (Allocator *)0x0) {
        local_60 = local_3c8.data;
        if (local_3c8.data != (void *)0x0) {
          free(local_3c8.data);
        }
      }
      else {
        (*(local_3c8.allocator)->_vptr_Allocator[3])(local_3c8.allocator,local_3c8.data);
      }
    }
  }
  pMVar7->data = (void *)0x0;
  pMVar7->elemsize = 0;
  pMVar7->elempack = 0;
  pMVar7->dims = 0;
  pMVar7->w = 0;
  pMVar7->h = 0;
  pMVar7->d = 0;
  pMVar7->c = 0;
  pMVar7->cstep = 0;
  pMVar7->refcount = (int *)0x0;
  ppvVar6 = &local_380;
  local_1b0 = ppvVar6;
  local_c8 = ppvVar6;
  if (local_378 != (int *)0x0) {
    local_cc = 0xffffffff;
    LOCK();
    local_d0 = *local_378;
    *local_378 = *local_378 + -1;
    UNLOCK();
    if (local_d0 == 1) {
      if (local_360 == (long *)0x0) {
        local_50 = local_380;
        if (local_380 != (void *)0x0) {
          free(local_380);
        }
      }
      else {
        (**(code **)(*local_360 + 0x18))(local_360,local_380);
      }
    }
  }
  *ppvVar6 = (void *)0x0;
  ppvVar6[2] = (void *)0x0;
  *(undefined4 *)(ppvVar6 + 3) = 0;
  *(undefined4 *)(ppvVar6 + 5) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x2c) = 0;
  *(undefined4 *)(ppvVar6 + 6) = 0;
  *(undefined4 *)((long)ppvVar6 + 0x34) = 0;
  *(undefined4 *)(ppvVar6 + 7) = 0;
  ppvVar6[8] = (void *)0x0;
  ppvVar6[1] = (void *)0x0;
  pAVar5 = &local_2e0;
  local_1a0 = pAVar5;
  local_e8 = pAVar5;
  if (local_2d8 != (int *)0x0) {
    local_ec = 0xffffffff;
    LOCK();
    local_f0 = *local_2d8;
    *local_2d8 = *local_2d8 + -1;
    UNLOCK();
    if (local_f0 == 1) {
      if (local_2c0 == (long *)0x0) {
        local_40 = local_2e0._vptr_Allocator;
        if (local_2e0._vptr_Allocator != (_func_int **)0x0) {
          free(local_2e0._vptr_Allocator);
        }
      }
      else {
        (**(code **)(*local_2c0 + 0x18))(local_2c0,local_2e0._vptr_Allocator);
      }
    }
  }
  pAVar5->_vptr_Allocator = (_func_int **)0x0;
  pAVar5[2]._vptr_Allocator = (_func_int **)0x0;
  *(undefined4 *)&pAVar5[3]._vptr_Allocator = 0;
  *(undefined4 *)&pAVar5[5]._vptr_Allocator = 0;
  *(undefined4 *)((long)&pAVar5[5]._vptr_Allocator + 4) = 0;
  *(undefined4 *)&pAVar5[6]._vptr_Allocator = 0;
  *(undefined4 *)((long)&pAVar5[6]._vptr_Allocator + 4) = 0;
  *(undefined4 *)&pAVar5[7]._vptr_Allocator = 0;
  pAVar5[8]._vptr_Allocator = (_func_int **)0x0;
  pAVar5[1]._vptr_Allocator = (_func_int **)0x0;
  ppMVar4 = &local_288;
  if (local_280 != (Mat *)0x0) {
    local_10c = 0xffffffff;
    LOCK();
    local_110 = *(int *)&local_280->data;
    *(int *)&local_280->data = *(int *)&local_280->data + -1;
    UNLOCK();
    if (local_110 == 1) {
      local_190 = ppMVar4;
      local_108 = ppMVar4;
      if (local_268 == (Mat *)0x0) {
        if (local_288 != (Mat *)0x0) {
          free(local_288);
        }
      }
      else {
        (**(code **)((long)local_268->data + 0x18))(local_268,local_288);
      }
    }
  }
  *ppMVar4 = (Mat *)0x0;
  ppMVar4[2] = (Mat *)0x0;
  *(undefined4 *)(ppMVar4 + 3) = 0;
  *(undefined4 *)(ppMVar4 + 5) = 0;
  *(undefined4 *)((long)ppMVar4 + 0x2c) = 0;
  *(undefined4 *)(ppMVar4 + 6) = 0;
  *(undefined4 *)((long)ppMVar4 + 0x34) = 0;
  *(undefined4 *)(ppMVar4 + 7) = 0;
  ppMVar4[8] = (Mat *)0x0;
  ppMVar4[1] = (Mat *)0x0;
  return;
}

Assistant:

static void conv3x3s1_winograd23_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel_tm, const Mat& bias, const Option& opt)
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int inch = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    // pad to 2n+2
    Mat bottom_blob_bordered = bottom_blob;

    outw = (outw + 1) / 2 * 2;
    outh = (outh + 1) / 2 * 2;

    w = outw + 2;
    h = outh + 2;
    copy_make_border(bottom_blob, bottom_blob_bordered, 0, h - bottom_blob.h, 0, w - bottom_blob.w, BORDER_CONSTANT, 0.f, opt);

    // BEGIN transform input
    Mat bottom_blob_tm;
    {
        int w_tiles = outw / 2;
        int h_tiles = outh / 2;
        int tiles = w_tiles * h_tiles;

        bottom_blob_tm.create(tiles, 16, inch, elemsize, elempack, opt.workspace_allocator);
        conv3x3s1_winograd23_transform_input_pack8_avx(bottom_blob_bordered, bottom_blob_tm, opt);
    }
    bottom_blob_bordered = Mat();
    // END transform input

    // BEGIN dot
    Mat top_blob_tm;
    convolution_winograd_dot_pack8_avx(bottom_blob_tm, outch, kernel_tm, top_blob_tm, opt);
    // END dot

    // BEGIN transform output
    Mat top_blob_bordered;
    if (outw == top_blob.w && outh == top_blob.h)
    {
        top_blob_bordered = top_blob;
    }
    else
    {
        top_blob_bordered.create(outw, outh, outch, elemsize, elempack, opt.workspace_allocator);
    }
    {
        conv3x3s1_winograd23_transform_output_pack8_avx(top_blob_tm, top_blob_bordered, bias, opt);
    }
    // END transform output

    // cut result pad
    copy_cut_border(top_blob_bordered, top_blob, 0, top_blob_bordered.h - top_blob.h, 0, top_blob_bordered.w - top_blob.w, opt);
}